

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall OpenMD::SelectionEvaluator::predefine(SelectionEvaluator *this,string *script)

{
  byte bVar1;
  size_type sVar2;
  reference pvVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_bool>
  pVar4;
  string variable;
  int tok;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> statement;
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  aatoken;
  SelectionCompiler *in_stack_fffffffffffffdf8;
  string *message;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  value_type *in_stack_fffffffffffffe08;
  any *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *script_00;
  string *filename;
  SelectionCompiler *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_fffffffffffffe48;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_fffffffffffffe50;
  string local_1a8 [16];
  undefined8 in_stack_fffffffffffffe68;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  _Base_ptr local_108;
  undefined1 local_100;
  string local_c8 [36];
  uint local_a4;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> local_a0;
  undefined4 local_84;
  string local_80 [32];
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  local_60;
  undefined1 local_31 [49];
  
  filename = (string *)local_31;
  script_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,(allocator<char> *)filename
            );
  bVar1 = SelectionCompiler::compile(in_stack_fffffffffffffe38,filename,&script_00->first);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  if ((bVar1 & 1) == 0) {
    message = (string *)local_1a8;
    std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::operator+(&in_stack_fffffffffffffe08->first,
                   (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    SelectionCompiler::getErrorMessage_abi_cxx11_((SelectionCompiler *)in_stack_fffffffffffffe68);
    std::operator+(&in_stack_fffffffffffffe38->filename,filename);
    evalError((SelectionEvaluator *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
              message);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
  }
  else {
    SelectionCompiler::getAatokenCompiled(in_stack_fffffffffffffdf8);
    sVar2 = std::
            vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            ::size(&local_60);
    if (sVar2 == 1) {
      std::
      vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
      ::operator[](&local_60,0);
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::vector
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      sVar2 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size(&local_a0);
      if (sVar2 < 3) {
        std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        evalError((SelectionEvaluator *)
                  CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                  &in_stack_fffffffffffffdf8->filename);
        std::__cxx11::string::~string(local_148);
      }
      else {
        pvVar3 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[](&local_a0,1)
        ;
        local_a4 = pvVar3->tok;
        if ((local_a4 == 1) || ((local_a4 & 0x4400) == 0x4400)) {
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[](&local_a0,1);
          std::any_cast<std::__cxx11::string>((any *)in_stack_fffffffffffffe08);
          in_stack_fffffffffffffe10 = &script_00[0x1a].second;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_&,_true>
                    (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(bVar1,in_stack_fffffffffffffe18),
                     (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                     in_stack_fffffffffffffe10);
          pVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                            *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          local_108 = (_Base_ptr)pVar4.first._M_node;
          local_100 = pVar4.second;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                   *)CONCAT17(local_100,in_stack_fffffffffffffe00));
          std::__cxx11::string::~string(local_c8);
        }
        else {
          std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          evalError((SelectionEvaluator *)
                    CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                    &in_stack_fffffffffffffdf8->filename);
          std::__cxx11::string::~string(local_128);
        }
      }
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector
                ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)in_stack_fffffffffffffe10)
      ;
      local_84 = 0;
    }
    else {
      std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      evalError((SelectionEvaluator *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                &in_stack_fffffffffffffdf8->filename);
      std::__cxx11::string::~string(local_80);
      local_84 = 1;
    }
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::~vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
               *)in_stack_fffffffffffffe10);
  }
  return;
}

Assistant:

void SelectionEvaluator::predefine(const std::string& script) {
    if (compiler.compile("#predefine", script)) {
      std::vector<std::vector<Token>> aatoken = compiler.getAatokenCompiled();
      if (aatoken.size() != 1) {
        evalError("predefinition does not have exactly 1 command:" + script);
        return;
      }
      std::vector<Token> statement = aatoken[0];
      if (statement.size() > 2) {
        int tok = statement[1].tok;
        if (tok == Token::identifier ||
            (tok & Token::predefinedset) == Token::predefinedset) {
          std::string variable = std::any_cast<std::string>(statement[1].value);
          variables.insert(VariablesType::value_type(variable, statement));

        } else {
          evalError("invalid variable name:" + script);
        }
      } else {
        evalError("bad predefinition length:" + script);
      }

    } else {
      evalError("predefined set compile error:" + script +
                "\ncompile error:" + compiler.getErrorMessage());
    }
  }